

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O0

int testSamePaddingConvolution2(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  ArrayFeatureType_ShapeRange *pAVar5;
  SizeRange *pSVar6;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  ConvolutionLayerParams *this_02;
  WeightParams *this_03;
  ShapeConstraint *pSVar7;
  ShapeRange *pSVar8;
  size_t sVar9;
  ostream *poVar10;
  RangeValue RVar11;
  RangeValue local_208;
  RangeValue local_1f8;
  RangeValue local_1e8;
  RangeValue local_1d8;
  RangeValue local_1c8;
  allocator<char> local_1b1;
  string local_1b0;
  ShapeConstraint *local_190;
  ShapeConstraint *outShape;
  size_t local_180;
  RangeValue local_178;
  RangeValue local_168;
  RangeValue local_158;
  RangeValue local_148;
  undefined4 local_138;
  allocator<char> local_131;
  string local_130;
  ShapeConstraint *local_110;
  ShapeConstraint *inShape;
  NeuralNetworkShaper shapes;
  int i;
  ConvolutionLayerParams *convParams;
  NeuralNetworkLayer *convLayer;
  NeuralNetwork *nn;
  FeatureDescription *out;
  SizeRange *shape3;
  SizeRange *shape2;
  SizeRange *shape1;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar6 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar5);
  CoreML::Specification::SizeRange::set_lowerbound(pSVar6,4);
  CoreML::Specification::SizeRange::set_upperbound(pSVar6,4);
  pAVar5 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar6 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar5);
  CoreML::Specification::SizeRange::set_lowerbound(pSVar6,100);
  CoreML::Specification::SizeRange::set_upperbound(pSVar6,100);
  pAVar5 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar6 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar5);
  CoreML::Specification::SizeRange::set_lowerbound(pSVar6,100);
  CoreML::Specification::SizeRange::set_upperbound(pSVar6,200);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"output");
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_convolution(this_01);
  CoreML::Specification::ConvolutionLayerParams::set_outputchannels(this_02,5);
  CoreML::Specification::ConvolutionLayerParams::set_kernelchannels(this_02,4);
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(this_02,7);
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(this_02,8);
  CoreML::Specification::ConvolutionLayerParams::mutable_same(this_02);
  CoreML::Specification::ConvolutionLayerParams::add_stride(this_02,2);
  CoreML::Specification::ConvolutionLayerParams::add_stride(this_02,3);
  CoreML::Specification::ConvolutionLayerParams::set_hasbias(this_02,false);
  for (shapes.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      shapes.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < 0x460;
      shapes.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           shapes.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    this_03 = CoreML::Specification::ConvolutionLayerParams::mutable_weights(this_02);
    CoreML::Specification::WeightParams::add_floatvalue(this_03,1.0);
  }
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper
            ((NeuralNetworkShaper *)&inShape,(Model *)&topIn,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"input",&local_131);
  pSVar7 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)&inShape,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  local_110 = pSVar7;
  pSVar8 = CoreML::ShapeConstraint::sequenceRange(pSVar7);
  sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
  if (sVar9 == 0) {
    pSVar8 = CoreML::ShapeConstraint::sequenceRange(local_110);
    RVar11 = CoreML::ShapeRange::maximumValue(pSVar8);
    local_148._val = RVar11._val;
    local_148._isUnbound = RVar11._isUnbound;
    bVar1 = CoreML::RangeValue::isUnbound(&local_148);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pSVar8 = CoreML::ShapeConstraint::batchRange(local_110);
      sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
      if (sVar9 == 0) {
        pSVar8 = CoreML::ShapeConstraint::batchRange(local_110);
        RVar11 = CoreML::ShapeRange::maximumValue(pSVar8);
        local_158._val = RVar11._val;
        local_158._isUnbound = RVar11._isUnbound;
        bVar1 = CoreML::RangeValue::isUnbound(&local_158);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          pSVar8 = CoreML::ShapeConstraint::channelRange(local_110);
          sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
          if (sVar9 == 4) {
            pSVar8 = CoreML::ShapeConstraint::channelRange(local_110);
            RVar11 = CoreML::ShapeRange::maximumValue(pSVar8);
            local_168._val = RVar11._val;
            local_168._isUnbound = RVar11._isUnbound;
            sVar9 = CoreML::RangeValue::value(&local_168);
            if (sVar9 == 4) {
              pSVar8 = CoreML::ShapeConstraint::heightRange(local_110);
              sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
              if (sVar9 == 100) {
                pSVar8 = CoreML::ShapeConstraint::heightRange(local_110);
                RVar11 = CoreML::ShapeRange::maximumValue(pSVar8);
                local_178._val = RVar11._val;
                local_178._isUnbound = RVar11._isUnbound;
                sVar9 = CoreML::RangeValue::value(&local_178);
                if (sVar9 == 100) {
                  pSVar8 = CoreML::ShapeConstraint::widthRange(local_110);
                  sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                  if (sVar9 == 100) {
                    pSVar8 = CoreML::ShapeConstraint::widthRange(local_110);
                    RVar11 = CoreML::ShapeRange::maximumValue(pSVar8);
                    local_180 = RVar11._val;
                    outShape._0_1_ = RVar11._isUnbound;
                    sVar9 = CoreML::RangeValue::value((RangeValue *)&outShape);
                    if (sVar9 == 200) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_1b0,"output",&local_1b1);
                      pSVar7 = CoreML::NeuralNetworkShaper::shape
                                         ((NeuralNetworkShaper *)&inShape,&local_1b0);
                      std::__cxx11::string::~string((string *)&local_1b0);
                      std::allocator<char>::~allocator(&local_1b1);
                      local_190 = pSVar7;
                      pSVar8 = CoreML::ShapeConstraint::sequenceRange(pSVar7);
                      sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                      if (sVar9 == 0) {
                        pSVar8 = CoreML::ShapeConstraint::sequenceRange(local_190);
                        RVar11 = CoreML::ShapeRange::maximumValue(pSVar8);
                        local_1c8._val = RVar11._val;
                        local_1c8._isUnbound = RVar11._isUnbound;
                        bVar1 = CoreML::RangeValue::isUnbound(&local_1c8);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          pSVar8 = CoreML::ShapeConstraint::batchRange(local_190);
                          sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                          if (sVar9 == 0) {
                            pSVar8 = CoreML::ShapeConstraint::batchRange(local_190);
                            RVar11 = CoreML::ShapeRange::maximumValue(pSVar8);
                            local_1d8._val = RVar11._val;
                            local_1d8._isUnbound = RVar11._isUnbound;
                            bVar1 = CoreML::RangeValue::isUnbound(&local_1d8);
                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                              pSVar8 = CoreML::ShapeConstraint::channelRange(local_190);
                              sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                              if (sVar9 == 5) {
                                pSVar8 = CoreML::ShapeConstraint::channelRange(local_190);
                                RVar11 = CoreML::ShapeRange::maximumValue(pSVar8);
                                local_1e8._val = RVar11._val;
                                local_1e8._isUnbound = RVar11._isUnbound;
                                sVar9 = CoreML::RangeValue::value(&local_1e8);
                                if (sVar9 == 5) {
                                  pSVar8 = CoreML::ShapeConstraint::heightRange(local_190);
                                  sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                                  if (sVar9 == 0x32) {
                                    pSVar8 = CoreML::ShapeConstraint::heightRange(local_190);
                                    RVar11 = CoreML::ShapeRange::maximumValue(pSVar8);
                                    local_1f8._val = RVar11._val;
                                    local_1f8._isUnbound = RVar11._isUnbound;
                                    sVar9 = CoreML::RangeValue::value(&local_1f8);
                                    if (sVar9 == 0x32) {
                                      pSVar8 = CoreML::ShapeConstraint::widthRange(local_190);
                                      sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                                      if (sVar9 == 0x22) {
                                        pSVar8 = CoreML::ShapeConstraint::widthRange(local_190);
                                        RVar11 = CoreML::ShapeRange::maximumValue(pSVar8);
                                        local_208._val = RVar11._val;
                                        local_208._isUnbound = RVar11._isUnbound;
                                        sVar9 = CoreML::RangeValue::value(&local_208);
                                        if (sVar9 == 0x43) {
                                          m1._oneof_case_[0] = 0;
                                        }
                                        else {
                                          poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                          poVar10 = std::operator<<(poVar10,":");
                                          poVar10 = (ostream *)
                                                    std::ostream::operator<<(poVar10,0x1e6);
                                          poVar10 = std::operator<<(poVar10,": error: ");
                                          poVar10 = std::operator<<(poVar10,
                                                  "outShape.widthRange().maximumValue().value() == 67"
                                                  );
                                          poVar10 = std::operator<<(poVar10,
                                                  " was false, expected true.");
                                          std::ostream::operator<<
                                                    (poVar10,std::endl<char,std::char_traits<char>>)
                                          ;
                                          m1._oneof_case_[0] = 1;
                                        }
                                      }
                                      else {
                                        poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                        poVar10 = std::operator<<(poVar10,":");
                                        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1e5)
                                        ;
                                        poVar10 = std::operator<<(poVar10,": error: ");
                                        poVar10 = std::operator<<(poVar10,
                                                  "outShape.widthRange().minimumValue() == 34");
                                        poVar10 = std::operator<<(poVar10,
                                                  " was false, expected true.");
                                        std::ostream::operator<<
                                                  (poVar10,std::endl<char,std::char_traits<char>>);
                                        m1._oneof_case_[0] = 1;
                                      }
                                    }
                                    else {
                                      poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                      poVar10 = std::operator<<(poVar10,":");
                                      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1e3);
                                      poVar10 = std::operator<<(poVar10,": error: ");
                                      poVar10 = std::operator<<(poVar10,
                                                  "outShape.heightRange().maximumValue().value() == 50"
                                                  );
                                      poVar10 = std::operator<<(poVar10," was false, expected true."
                                                               );
                                      std::ostream::operator<<
                                                (poVar10,std::endl<char,std::char_traits<char>>);
                                      m1._oneof_case_[0] = 1;
                                    }
                                  }
                                  else {
                                    poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                    poVar10 = std::operator<<(poVar10,":");
                                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1e2);
                                    poVar10 = std::operator<<(poVar10,": error: ");
                                    poVar10 = std::operator<<(poVar10,
                                                  "outShape.heightRange().minimumValue() == 50");
                                    poVar10 = std::operator<<(poVar10," was false, expected true.");
                                    std::ostream::operator<<
                                              (poVar10,std::endl<char,std::char_traits<char>>);
                                    m1._oneof_case_[0] = 1;
                                  }
                                }
                                else {
                                  poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                  poVar10 = std::operator<<(poVar10,":");
                                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1e0);
                                  poVar10 = std::operator<<(poVar10,": error: ");
                                  poVar10 = std::operator<<(poVar10,
                                                  "outShape.channelRange().maximumValue().value() == 5"
                                                  );
                                  poVar10 = std::operator<<(poVar10," was false, expected true.");
                                  std::ostream::operator<<
                                            (poVar10,std::endl<char,std::char_traits<char>>);
                                  m1._oneof_case_[0] = 1;
                                }
                              }
                              else {
                                poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                poVar10 = std::operator<<(poVar10,":");
                                poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1df);
                                poVar10 = std::operator<<(poVar10,": error: ");
                                poVar10 = std::operator<<(poVar10,
                                                  "outShape.channelRange().minimumValue() == 5");
                                poVar10 = std::operator<<(poVar10," was false, expected true.");
                                std::ostream::operator<<
                                          (poVar10,std::endl<char,std::char_traits<char>>);
                                m1._oneof_case_[0] = 1;
                              }
                            }
                            else {
                              poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                              poVar10 = std::operator<<(poVar10,":");
                              poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1dd);
                              poVar10 = std::operator<<(poVar10,": error: ");
                              poVar10 = std::operator<<(poVar10,
                                                  "outShape.batchRange().maximumValue().isUnbound()"
                                                  );
                              poVar10 = std::operator<<(poVar10," was false, expected true.");
                              std::ostream::operator<<
                                        (poVar10,std::endl<char,std::char_traits<char>>);
                              m1._oneof_case_[0] = 1;
                            }
                          }
                          else {
                            poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                            poVar10 = std::operator<<(poVar10,":");
                            poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1dc);
                            poVar10 = std::operator<<(poVar10,": error: ");
                            poVar10 = std::operator<<(poVar10,
                                                  "outShape.batchRange().minimumValue() == 0");
                            poVar10 = std::operator<<(poVar10," was false, expected true.");
                            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>)
                            ;
                            m1._oneof_case_[0] = 1;
                          }
                        }
                        else {
                          poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                          poVar10 = std::operator<<(poVar10,":");
                          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1da);
                          poVar10 = std::operator<<(poVar10,": error: ");
                          poVar10 = std::operator<<(poVar10,
                                                  "outShape.sequenceRange().maximumValue().isUnbound()"
                                                  );
                          poVar10 = std::operator<<(poVar10," was false, expected true.");
                          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                          m1._oneof_case_[0] = 1;
                        }
                      }
                      else {
                        poVar10 = std::operator<<((ostream *)&std::cout,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                 );
                        poVar10 = std::operator<<(poVar10,":");
                        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1d9);
                        poVar10 = std::operator<<(poVar10,": error: ");
                        poVar10 = std::operator<<(poVar10,
                                                  "outShape.sequenceRange().minimumValue() == 0");
                        poVar10 = std::operator<<(poVar10," was false, expected true.");
                        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                        m1._oneof_case_[0] = 1;
                      }
                    }
                    else {
                      poVar10 = std::operator<<((ostream *)&std::cout,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                               );
                      poVar10 = std::operator<<(poVar10,":");
                      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1d6);
                      poVar10 = std::operator<<(poVar10,": error: ");
                      poVar10 = std::operator<<(poVar10,
                                                "inShape.widthRange().maximumValue().value() == 200"
                                               );
                      poVar10 = std::operator<<(poVar10," was false, expected true.");
                      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                      m1._oneof_case_[0] = 1;
                    }
                  }
                  else {
                    poVar10 = std::operator<<((ostream *)&std::cout,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                             );
                    poVar10 = std::operator<<(poVar10,":");
                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1d5);
                    poVar10 = std::operator<<(poVar10,": error: ");
                    poVar10 = std::operator<<(poVar10,"inShape.widthRange().minimumValue() == 100");
                    poVar10 = std::operator<<(poVar10," was false, expected true.");
                    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                    m1._oneof_case_[0] = 1;
                  }
                }
                else {
                  poVar10 = std::operator<<((ostream *)&std::cout,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                           );
                  poVar10 = std::operator<<(poVar10,":");
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1d3);
                  poVar10 = std::operator<<(poVar10,": error: ");
                  poVar10 = std::operator<<(poVar10,
                                            "inShape.heightRange().maximumValue().value() == 100");
                  poVar10 = std::operator<<(poVar10," was false, expected true.");
                  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                  m1._oneof_case_[0] = 1;
                }
              }
              else {
                poVar10 = std::operator<<((ostream *)&std::cout,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                         );
                poVar10 = std::operator<<(poVar10,":");
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1d2);
                poVar10 = std::operator<<(poVar10,": error: ");
                poVar10 = std::operator<<(poVar10,"inShape.heightRange().minimumValue() == 100");
                poVar10 = std::operator<<(poVar10," was false, expected true.");
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                m1._oneof_case_[0] = 1;
              }
            }
            else {
              poVar10 = std::operator<<((ostream *)&std::cout,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                       );
              poVar10 = std::operator<<(poVar10,":");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1d0);
              poVar10 = std::operator<<(poVar10,": error: ");
              poVar10 = std::operator<<(poVar10,"inShape.channelRange().maximumValue().value() == 4"
                                       );
              poVar10 = std::operator<<(poVar10," was false, expected true.");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              m1._oneof_case_[0] = 1;
            }
          }
          else {
            poVar10 = std::operator<<((ostream *)&std::cout,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                     );
            poVar10 = std::operator<<(poVar10,":");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1cf);
            poVar10 = std::operator<<(poVar10,": error: ");
            poVar10 = std::operator<<(poVar10,"inShape.channelRange().minimumValue() == 4");
            poVar10 = std::operator<<(poVar10," was false, expected true.");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            m1._oneof_case_[0] = 1;
          }
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cout,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                   );
          poVar10 = std::operator<<(poVar10,":");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1cd);
          poVar10 = std::operator<<(poVar10,": error: ");
          poVar10 = std::operator<<(poVar10,"inShape.batchRange().maximumValue().isUnbound()");
          poVar10 = std::operator<<(poVar10," was false, expected true.");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          m1._oneof_case_[0] = 1;
        }
      }
      else {
        poVar10 = std::operator<<((ostream *)&std::cout,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                 );
        poVar10 = std::operator<<(poVar10,":");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1cc);
        poVar10 = std::operator<<(poVar10,": error: ");
        poVar10 = std::operator<<(poVar10,"inShape.batchRange().minimumValue() == 0");
        poVar10 = std::operator<<(poVar10," was false, expected true.");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
      }
    }
    else {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1ca);
      poVar10 = std::operator<<(poVar10,": error: ");
      poVar10 = std::operator<<(poVar10,"inShape.sequenceRange().maximumValue().isUnbound()");
      poVar10 = std::operator<<(poVar10," was false, expected true.");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1c9);
    poVar10 = std::operator<<(poVar10,": error: ");
    poVar10 = std::operator<<(poVar10,"inShape.sequenceRange().minimumValue() == 0");
    poVar10 = std::operator<<(poVar10," was false, expected true.");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  local_138 = 1;
  CoreML::NeuralNetworkShaper::~NeuralNetworkShaper((NeuralNetworkShaper *)&inShape);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testSamePaddingConvolution2() {
    
    Specification::Model m1;
    
    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *shape1 = shape->mutable_shaperange()->add_sizeranges();
    shape1->set_lowerbound(4);
    shape1->set_upperbound(4);
    auto *shape2 = shape->mutable_shaperange()->add_sizeranges();
    shape2->set_lowerbound(100);
    shape2->set_upperbound(100);
    auto *shape3 = shape->mutable_shaperange()->add_sizeranges();
    shape3->set_lowerbound(100);
    shape3->set_upperbound(200);
    
    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m1.mutable_neuralnetwork();
    
    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("output");
    Specification::ConvolutionLayerParams *convParams = convLayer->mutable_convolution();
    convParams->set_outputchannels(5);
    convParams->set_kernelchannels(4);
    convParams->add_kernelsize(7);
    convParams->add_kernelsize(8);
    convParams->mutable_same();
    convParams->add_stride(2);
    convParams->add_stride(3);
    convParams->set_hasbias(false);
    for (int i = 0; i < 5*4*7*8; i++) {
        convParams->mutable_weights()->add_floatvalue(1.0);
    }
    
    NeuralNetworkShaper shapes(m1);
    
    const ShapeConstraint &inShape = shapes.shape("input");
    ML_ASSERT(inShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(inShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.batchRange().minimumValue() == 0);
    ML_ASSERT(inShape.batchRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.channelRange().minimumValue() == 4);
    ML_ASSERT(inShape.channelRange().maximumValue().value() == 4);
    
    ML_ASSERT(inShape.heightRange().minimumValue() == 100);
    ML_ASSERT(inShape.heightRange().maximumValue().value() == 100);
    
    ML_ASSERT(inShape.widthRange().minimumValue() == 100);
    ML_ASSERT(inShape.widthRange().maximumValue().value() == 200);
    
    const ShapeConstraint &outShape = shapes.shape("output");
    ML_ASSERT(outShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(outShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(outShape.batchRange().minimumValue() == 0);
    ML_ASSERT(outShape.batchRange().maximumValue().isUnbound());
    
    ML_ASSERT(outShape.channelRange().minimumValue() == 5);
    ML_ASSERT(outShape.channelRange().maximumValue().value() == 5);
    
    ML_ASSERT(outShape.heightRange().minimumValue() == 50);
    ML_ASSERT(outShape.heightRange().maximumValue().value() == 50);
    
    ML_ASSERT(outShape.widthRange().minimumValue() == 34);
    ML_ASSERT(outShape.widthRange().maximumValue().value() == 67);
    
    
    return 0;
    
}